

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

void bufq_init(bufq *q,bufc_pool *pool,size_t chunk_size,size_t max_chunks,int opts)

{
  int opts_local;
  size_t max_chunks_local;
  size_t chunk_size_local;
  bufc_pool *pool_local;
  bufq *q_local;
  
  memset(q,0,0x40);
  q->chunk_size = chunk_size;
  q->max_chunks = max_chunks;
  q->pool = pool;
  q->opts = opts;
  return;
}

Assistant:

static void bufq_init(struct bufq *q, struct bufc_pool *pool,
                      size_t chunk_size, size_t max_chunks, int opts)
{
  DEBUGASSERT(chunk_size > 0);
  DEBUGASSERT(max_chunks > 0);
  memset(q, 0, sizeof(*q));
  q->chunk_size = chunk_size;
  q->max_chunks = max_chunks;
  q->pool = pool;
  q->opts = opts;
}